

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaAllocator_T::GetHeapBudgets
          (VmaAllocator_T *this,VmaBudget *outBudgets,uint32_t firstHeap,uint32_t heapCount)

{
  VmaRWMutex *this_00;
  uint64_t *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  VmaMutexLockRead local_28;
  
  while( true ) {
    if (this->m_UseExtMemoryBudget == false) {
      for (lVar3 = 0; (ulong)heapCount * 0x28 - lVar3 != 0; lVar3 = lVar3 + 0x28) {
        *(__int_type_conflict1 *)((long)&(outBudgets->statistics).blockCount + lVar3) =
             (this->m_Budget).m_BlockCount[firstHeap].super___atomic_base<unsigned_int>._M_i;
        *(__int_type_conflict1 *)((long)&(outBudgets->statistics).allocationCount + lVar3) =
             (this->m_Budget).m_AllocationCount[firstHeap].super___atomic_base<unsigned_int>._M_i;
        *(__int_type_conflict2 *)((long)&(outBudgets->statistics).blockBytes + lVar3) =
             (this->m_Budget).m_BlockBytes[firstHeap].super___atomic_base<unsigned_long>._M_i;
        *(__int_type_conflict2 *)((long)&(outBudgets->statistics).allocationBytes + lVar3) =
             (this->m_Budget).m_AllocationBytes[firstHeap].super___atomic_base<unsigned_long>._M_i;
        *(undefined8 *)((long)&outBudgets->usage + lVar3) =
             *(undefined8 *)((long)&(outBudgets->statistics).blockBytes + lVar3);
        *(ulong *)((long)&outBudgets->budget + lVar3) =
             ((this->m_MemProps).memoryHeaps[firstHeap].size << 3) / 10;
        firstHeap = firstHeap + 1;
      }
      return;
    }
    if ((this->m_Budget).m_OperationsSinceBudgetFetch.super___atomic_base<unsigned_int>._M_i < 0x1e)
    break;
    UpdateVulkanBudget(this);
  }
  this_00 = &(this->m_Budget).m_BudgetMutex;
  local_28.m_pMutex = (VmaRWMutex *)0x0;
  if (this->m_UseMutex != false) {
    local_28.m_pMutex = this_00;
  }
  if (this->m_UseMutex == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this_00);
  }
  for (lVar3 = 0; (ulong)heapCount * 0x28 - lVar3 != 0; lVar3 = lVar3 + 0x28) {
    *(__int_type_conflict1 *)((long)&(outBudgets->statistics).blockCount + lVar3) =
         (this->m_Budget).m_BlockCount[firstHeap].super___atomic_base<unsigned_int>._M_i;
    *(__int_type_conflict1 *)((long)&(outBudgets->statistics).allocationCount + lVar3) =
         (this->m_Budget).m_AllocationCount[firstHeap].super___atomic_base<unsigned_int>._M_i;
    *(__int_type_conflict2 *)((long)&(outBudgets->statistics).blockBytes + lVar3) =
         (this->m_Budget).m_BlockBytes[firstHeap].super___atomic_base<unsigned_long>._M_i;
    *(__int_type_conflict2 *)((long)&(outBudgets->statistics).allocationBytes + lVar3) =
         (this->m_Budget).m_AllocationBytes[firstHeap].super___atomic_base<unsigned_long>._M_i;
    uVar4 = *(long *)((long)&(outBudgets->statistics).blockBytes + lVar3) +
            (this->m_Budget).m_VulkanUsage[firstHeap];
    puVar1 = (this->m_Budget).m_BlockBytesAtBudgetFetch + firstHeap;
    lVar5 = 0;
    if (*puVar1 <= uVar4) {
      lVar5 = uVar4 - *puVar1;
    }
    *(long *)((long)&outBudgets->usage + lVar3) = lVar5;
    uVar4 = (this->m_Budget).m_VulkanBudget[firstHeap];
    uVar2 = (this->m_MemProps).memoryHeaps[firstHeap].size;
    if (uVar2 < uVar4) {
      uVar4 = uVar2;
    }
    *(ulong *)((long)&outBudgets->budget + lVar3) = uVar4;
    firstHeap = firstHeap + 1;
  }
  VmaMutexLockRead::~VmaMutexLockRead(&local_28);
  return;
}

Assistant:

void VmaAllocator_T::GetHeapBudgets(VmaBudget* outBudgets, uint32_t firstHeap, uint32_t heapCount)
{
#if VMA_MEMORY_BUDGET
    if(m_UseExtMemoryBudget)
    {
        if(m_Budget.m_OperationsSinceBudgetFetch < 30)
        {
            VmaMutexLockRead lockRead(m_Budget.m_BudgetMutex, m_UseMutex);
            for(uint32_t i = 0; i < heapCount; ++i, ++outBudgets)
            {
                const uint32_t heapIndex = firstHeap + i;

                outBudgets->statistics.blockCount = m_Budget.m_BlockCount[heapIndex];
                outBudgets->statistics.allocationCount = m_Budget.m_AllocationCount[heapIndex];
                outBudgets->statistics.blockBytes = m_Budget.m_BlockBytes[heapIndex];
                outBudgets->statistics.allocationBytes = m_Budget.m_AllocationBytes[heapIndex];

                if(m_Budget.m_VulkanUsage[heapIndex] + outBudgets->statistics.blockBytes > m_Budget.m_BlockBytesAtBudgetFetch[heapIndex])
                {
                    outBudgets->usage = m_Budget.m_VulkanUsage[heapIndex] +
                        outBudgets->statistics.blockBytes - m_Budget.m_BlockBytesAtBudgetFetch[heapIndex];
                }
                else
                {
                    outBudgets->usage = 0;
                }

                // Have to take MIN with heap size because explicit HeapSizeLimit is included in it.
                outBudgets->budget = VMA_MIN(
                    m_Budget.m_VulkanBudget[heapIndex], m_MemProps.memoryHeaps[heapIndex].size);
            }
        }
        else
        {
            UpdateVulkanBudget(); // Outside of mutex lock
            GetHeapBudgets(outBudgets, firstHeap, heapCount); // Recursion
        }
    }
    else
#endif
    {
        for(uint32_t i = 0; i < heapCount; ++i, ++outBudgets)
        {
            const uint32_t heapIndex = firstHeap + i;

            outBudgets->statistics.blockCount = m_Budget.m_BlockCount[heapIndex];
            outBudgets->statistics.allocationCount = m_Budget.m_AllocationCount[heapIndex];
            outBudgets->statistics.blockBytes = m_Budget.m_BlockBytes[heapIndex];
            outBudgets->statistics.allocationBytes = m_Budget.m_AllocationBytes[heapIndex];

            outBudgets->usage = outBudgets->statistics.blockBytes;
            outBudgets->budget = m_MemProps.memoryHeaps[heapIndex].size * 8 / 10; // 80% heuristics.
        }
    }
}